

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O3

ostream * cali::operator<<(ostream *os,Attribute *a)

{
  int prop;
  cali_attr_type type;
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  char buf [256];
  string local_138;
  char local_118 [256];
  
  prop = Attribute::properties(a);
  cali_prop2string(prop,local_118,0x100);
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ \"id\" : ",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", \"name\" : \"",0xc);
  Attribute::name_abi_cxx11_(&local_138,a);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", \"type\" : \"",0xc);
  type = Attribute::type(a);
  __s = cali_type2string(type);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", \"properties\" : \"",0x12);
  sVar2 = strlen(local_118);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_118,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" }",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

std::ostream& cali::operator<< (std::ostream& os, const Attribute& a)
{
    char buf[256];

    cali_prop2string(a.properties(), buf, 256);

    return os << "{ \"id\" : " << a.id() << ", \"name\" : \"" << a.name() << "\""
              << ", \"type\" : \"" << cali_type2string(a.type()) << "\""
              << ", \"properties\" : \"" << buf << "\" }";
}